

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

void tcu::fillWithComponentGradients1D(PixelBufferAccess *access,Vec4 *minVal,Vec4 *maxVal)

{
  Vec4 *this;
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Vector<float,_4> local_48;
  float local_38;
  float local_34;
  float a;
  float b;
  float g;
  float r;
  float s;
  int x;
  Vec4 *maxVal_local;
  Vec4 *minVal_local;
  PixelBufferAccess *access_local;
  
  r = 0.0;
  _s = maxVal;
  maxVal_local = minVal;
  minVal_local = (Vec4 *)access;
  while( true ) {
    fVar2 = r;
    iVar1 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)minVal_local);
    if (iVar1 <= (int)fVar2) break;
    fVar2 = (float)(int)r;
    iVar1 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)minVal_local);
    fVar2 = (fVar2 + 0.5) / (float)iVar1;
    g = fVar2;
    fVar3 = Vector<float,_4>::x(maxVal_local);
    fVar4 = Vector<float,_4>::x(_s);
    b = linearInterpolate(fVar2,fVar3,fVar4);
    fVar2 = g;
    fVar3 = Vector<float,_4>::y(maxVal_local);
    fVar4 = Vector<float,_4>::y(_s);
    a = linearInterpolate(fVar2,fVar3,fVar4);
    fVar2 = g;
    fVar3 = Vector<float,_4>::z(maxVal_local);
    fVar4 = Vector<float,_4>::z(_s);
    local_34 = linearInterpolate(fVar2,fVar3,fVar4);
    fVar2 = g;
    fVar3 = Vector<float,_4>::w(maxVal_local);
    fVar4 = Vector<float,_4>::w(_s);
    local_38 = linearInterpolate(fVar2,fVar3,fVar4);
    this = minVal_local;
    Vector<float,_4>::Vector(&local_48,b,a,local_34,local_38);
    PixelBufferAccess::setPixel((PixelBufferAccess *)this,&local_48,(int)r,0,0);
    r = (float)((int)r + 1);
  }
  return;
}

Assistant:

static void fillWithComponentGradients1D (const PixelBufferAccess& access, const Vec4& minVal, const Vec4& maxVal)
{
	DE_ASSERT(access.getHeight() == 1);
	for (int x = 0; x < access.getWidth(); x++)
	{
		float s = ((float)x + 0.5f) / (float)access.getWidth();

		float r = linearInterpolate(s, minVal.x(), maxVal.x());
		float g = linearInterpolate(s, minVal.y(), maxVal.y());
		float b = linearInterpolate(s, minVal.z(), maxVal.z());
		float a = linearInterpolate(s, minVal.w(), maxVal.w());

		access.setPixel(tcu::Vec4(r, g, b, a), x, 0);
	}
}